

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_macro_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *pgVar1;
  gravity_delegate_t *pgVar2;
  gtoken_s token_00;
  gnode_t *ast;
  _Bool _Var3;
  gtoken_t gVar4;
  uint32_t uVar5;
  int iVar6;
  gnode_t *extraout_RAX;
  char *pcVar7;
  gnode_t *ast_00;
  gnode_t *ast_01;
  gnode_t *ast_02;
  gnode_t *extraout_RAX_00;
  gravity_lexer_t *pgVar8;
  gravity_lexer_t **ppgVar9;
  gnode_t *extraout_RAX_01;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  gravity_class_t **ppgVar10;
  gnode_t *pgVar11;
  gnode_t *extraout_RAX_02;
  gnode_t *extraout_RAX_03;
  gnode_t *extraout_RAX_04;
  gnode_t *extraout_RAX_05;
  gnode_t *extraout_RAX_06;
  gnode_t *extraout_RAX_07;
  gnode_t *extraout_RAX_08;
  lexer_r *plVar12;
  char *pcVar13;
  size_t sVar14;
  error_type_t error_type;
  size_t sVar15;
  gravity_parser_t *parser_00;
  uint32_t uVar16;
  bool bVar17;
  gravity_value_t v;
  ulong uStackY_930;
  _Bool local_8f9;
  gravity_class_t *local_8f8;
  gnode_t *local_8f0;
  uint32_t fileid;
  gravity_parser_t *local_8e0;
  char *local_8d8;
  gnode_t *local_8d0;
  gnode_t *local_8c8;
  size_t size;
  ulong local_8b8;
  gtoken_s token;
  char buffer [1024];
  gravity_parser_t local_438 [10];
  
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar4 = gravity_lexer_next(pgVar1);
  if (gVar4 != TOK_MACRO) {
    __assert_fail("type == TOK_MACRO",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x96f,"gnode_t *parse_macro_statement(gravity_parser_t *)");
  }
  gVar4 = gravity_lexer_peek(pgVar1);
  if ((gVar4 == TOK_OP_NOT) && (uVar5 = gravity_lexer_lineno(pgVar1), uVar5 == 1)) {
    gVar4 = gravity_lexer_next(pgVar1);
    if (gVar4 == TOK_OP_NOT) {
      gravity_lexer_skip_line(pgVar1);
      return extraout_RAX;
    }
    __assert_fail("type == TOK_OP_NOT",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x976,"gnode_t *parse_macro_statement(gravity_parser_t *)");
  }
  pcVar7 = parse_identifier(parser);
  if (pcVar7 == (char *)0x0) {
LAB_0011abd7:
    gravity_lexer_token(pgVar1);
    pcVar13 = "%s";
    pcVar7 = "Unknown macro token. Declaration will be ignored.";
    error_type = GRAVITY_WARNING;
LAB_0011ac19:
    report_error(parser,error_type,pcVar13,pcVar7);
    return extraout_RAX_00;
  }
  iVar6 = string_cmp(pcVar7,"unittest");
  if (iVar6 == 0) {
    iVar6 = 1;
  }
  else {
    iVar6 = string_cmp(pcVar7,"include");
    if (iVar6 == 0) {
      iVar6 = 2;
    }
    else {
      iVar6 = string_cmp(pcVar7,"push");
      if (iVar6 == 0) {
        iVar6 = 3;
      }
      else {
        iVar6 = string_cmp(pcVar7,"pop");
        iVar6 = (uint)(iVar6 == 0) << 2;
      }
    }
  }
  free(pcVar7);
  gravity_lexer_token(pgVar1);
  token.type = TOK_MACRO;
  pgVar2 = parser->delegate;
  if ((pgVar2 != (gravity_delegate_t *)0x0) &&
     (pgVar2->parser_callback != (gravity_parser_callback)0x0)) {
    (*pgVar2->parser_callback)(&token,pgVar2->xdata);
  }
  if (iVar6 == 2) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    while( true ) {
      gVar4 = gravity_lexer_next(pgVar1);
      parser_00 = local_438;
      gravity_lexer_token(pgVar1);
      buffer[0x20] = (undefined1)local_438[0].vdecl.n;
      buffer[0x21] = local_438[0].vdecl.n._1_1_;
      buffer[0x22] = local_438[0].vdecl.n._2_1_;
      buffer[0x23] = local_438[0].vdecl.n._3_1_;
      buffer[0x24] = local_438[0].vdecl.n._4_1_;
      buffer[0x25] = local_438[0].vdecl.n._5_1_;
      buffer[0x26] = local_438[0].vdecl.n._6_1_;
      buffer[0x27] = local_438[0].vdecl.n._7_1_;
      buffer._16_8_ = local_438[0].statements;
      buffer._24_8_ = local_438[0].delegate;
      buffer._0_8_ = local_438[0].lexer;
      buffer._8_8_ = local_438[0].declarations;
      if (gVar4 != TOK_STRING) break;
      if ((parser->delegate == (gravity_delegate_t *)0x0) ||
         (parser->delegate->loadfile_callback == (gravity_loadfile_callback)0x0)) {
        gravity_lexer_token(pgVar1);
        pcVar7 = "Unable to load file because no loadfile callback registered in delegate.";
        goto LAB_0011ae3b;
      }
      token_00.colno = (int)local_438[0].declarations;
      token_00._0_8_ = local_438[0].lexer;
      token_00.position = (int)((ulong)local_438[0].declarations >> 0x20);
      token_00.bytes = (int)local_438[0].statements;
      token_00.length = (int)((ulong)local_438[0].statements >> 0x20);
      token_00.fileid = (int)local_438[0].delegate;
      token_00.builtin = (int)((ulong)local_438[0].delegate >> 0x20);
      token_00.value = (char *)local_438[0].vdecl.n;
      pcVar7 = cstring_from_token(parser_00,token_00);
      size = 0;
      fileid = 0;
      local_8f9 = false;
      pcVar13 = (*parser->delegate->loadfile_callback)
                          (pcVar7,&size,&fileid,parser->delegate->xdata,&local_8f9);
      if ((pcVar13 == (char *)0x0) ||
         (pgVar8 = gravity_lexer_create(pcVar13,size,fileid,local_8f9),
         pgVar8 == (gravity_lexer_t *)0x0)) {
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x140b8f,pcVar7);
      }
      else {
        plVar12 = parser->lexer;
        sVar14 = plVar12->n;
        if (sVar14 == plVar12->m) {
          sVar15 = sVar14 * 2;
          if (sVar14 == 0) {
            sVar15 = 8;
          }
          plVar12->m = sVar15;
          ppgVar9 = (gravity_lexer_t **)realloc(plVar12->p,sVar15 << 3);
          plVar12 = parser->lexer;
          plVar12->p = ppgVar9;
          sVar14 = plVar12->n;
        }
        else {
          ppgVar9 = plVar12->p;
        }
        plVar12->n = sVar14 + 1;
        ppgVar9[sVar14] = pgVar8;
      }
      free(pcVar7);
      gVar4 = gravity_lexer_peek(pgVar1);
      if (gVar4 != TOK_OP_COMMA) {
        _Var3 = parse_semicolon(parser);
        return (gnode_t *)CONCAT71(extraout_var,_Var3);
      }
      gravity_lexer_next(pgVar1);
    }
    pcVar7 = token_name(gVar4);
    pcVar13 = "Expected file name but found %s.";
    error_type = GRAVITY_ERROR_SYNTAX;
    goto LAB_0011ac19;
  }
  if (iVar6 != 1) goto LAB_0011abd7;
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  if (parser->statements->n != 2) {
    gravity_lexer_token(pgVar1);
    pcVar7 = 
    "#unittest macro cannot be embedded in a statement (it must be the root of the document).";
LAB_0011ae3b:
    report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar7);
    return extraout_RAX_01;
  }
  parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  ast_02 = (gnode_t *)0x0;
  local_8d0 = (gnode_t *)0x0;
  local_8c8 = (gnode_t *)0x0;
  local_8f0 = (gnode_t *)0x0;
  ast_01 = (gnode_t *)0x0;
  ast_00 = (gnode_t *)0x0;
  while (gVar4 = gravity_lexer_peek(pgVar1), gVar4 != TOK_OP_CLOSED_CURLYBRACE) {
    pcVar7 = parse_identifier(parser);
    if (pcVar7 == (char *)0x0) goto LAB_0011b025;
    parse_required(parser,TOK_OP_COLON);
    iVar6 = string_cmp(pcVar7,"name");
    if (iVar6 == 0) {
      free(pcVar7);
      ast_00 = parse_literal_expression(parser);
      pgVar11 = ast_00;
joined_r0x0011ab13:
      if (pgVar11 == (gnode_t *)0x0) {
LAB_0011b025:
        pgVar1 = parser->lexer->p[parser->lexer->n - 1];
        do {
          gVar4 = gravity_lexer_next(pgVar1);
          if (gVar4 == TOK_OP_CLOSED_CURLYBRACE) {
            return (gnode_t *)CONCAT44(extraout_var_00,gVar4);
          }
        } while (gVar4 != TOK_EOF);
        return (gnode_t *)CONCAT44(extraout_var_00,gVar4);
      }
    }
    else {
      iVar6 = string_cmp(pcVar7,"note");
      if (iVar6 == 0) {
        free(pcVar7);
        ast_01 = parse_literal_expression(parser);
        pgVar11 = ast_01;
        goto joined_r0x0011ab13;
      }
      iVar6 = string_cmp(pcVar7,"error");
      if (iVar6 == 0) {
        free(pcVar7);
        local_8f0 = parse_identifier_expression(parser);
        pgVar11 = local_8f0;
        goto joined_r0x0011ab13;
      }
      iVar6 = string_cmp(pcVar7,"error_row");
      if (iVar6 == 0) {
        free(pcVar7);
        local_8c8 = parse_literal_expression(parser);
        pgVar11 = local_8c8;
        goto joined_r0x0011ab13;
      }
      iVar6 = string_cmp(pcVar7,"error_col");
      if (iVar6 == 0) {
        free(pcVar7);
        local_8d0 = parse_literal_expression(parser);
        pgVar11 = local_8d0;
        goto joined_r0x0011ab13;
      }
      iVar6 = string_cmp(pcVar7,"result");
      free(pcVar7);
      if (iVar6 != 0) {
        gravity_lexer_token(pgVar1);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x140ab2);
        goto LAB_0011b025;
      }
      gVar4 = gravity_lexer_peek(pgVar1);
      if ((gVar4 & ~TOK_ERROR) == TOK_OP_ADD) {
        gVar4 = gravity_lexer_next(pgVar1);
        bVar17 = gVar4 != TOK_OP_SUB;
LAB_0011ab8c:
        ast_02 = parse_literal_expression(parser);
        pgVar11 = ast_02;
        if ((ast_02 == (gnode_t *)0x0) || (bVar17)) goto joined_r0x0011ab13;
        if (ast_02[1].tag == NODE_COMPOUND_STAT) {
          *(ulong *)&ast_02[1].block_length = *(ulong *)&ast_02[1].block_length ^ 0x8000000000000000
          ;
        }
        else if (ast_02[1].tag == NODE_LABEL_STAT) {
          *(long *)&ast_02[1].block_length = -*(long *)&ast_02[1].block_length;
        }
      }
      else {
        bVar17 = true;
        if (gVar4 != TOK_KEY_NULL) goto LAB_0011ab8c;
        gravity_lexer_next(pgVar1);
        ast_02 = (gnode_t *)0x0;
      }
    }
    parse_semicolon(parser);
  }
  parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
  parse_semicolon(parser);
  pgVar11 = local_8f0;
  local_8f8 = gravity_class_null;
  if (ast_00 == (gnode_t *)0x0) {
    local_8d8 = (char *)0x0;
  }
  else if (ast_00[1].tag == NODE_LIST_STAT) {
    local_8d8 = buffer;
    snprintf(local_8d8,0x400,"%.*s",(ulong)ast_00[1].refcount,*(undefined8 *)&ast_00[1].block_length
            );
  }
  else {
    local_8d8 = (char *)0x0;
  }
  uStackY_930 = 0;
  if ((ast_01 == (gnode_t *)0x0) || (ast_01[1].tag != NODE_LIST_STAT)) {
    local_8e0 = (gravity_parser_t *)0x0;
  }
  else {
    local_8e0 = local_438;
    snprintf((char *)local_8e0,0x400,"%.*s",(ulong)ast_01[1].refcount,
             *(undefined8 *)&ast_01[1].block_length);
  }
  if ((pgVar11 != (gnode_t *)0x0) &&
     (iVar6 = string_cmp(*(char **)(pgVar11 + 1),"NONE"), iVar6 != 0)) {
    iVar6 = string_cmp(*(char **)(pgVar11 + 1),"SYNTAX");
    if (iVar6 == 0) {
      uStackY_930 = 1;
    }
    else {
      iVar6 = string_cmp(*(char **)(pgVar11 + 1),"SEMANTIC");
      if (iVar6 == 0) {
        uStackY_930 = 2;
      }
      else {
        iVar6 = string_cmp(*(char **)(pgVar11 + 1),"RUNTIME");
        if (iVar6 == 0) {
          uStackY_930 = 3;
        }
        else {
          iVar6 = string_cmp(*(char **)(pgVar11 + 1),"WARNING");
          uStackY_930 = (ulong)((uint)(iVar6 == 0) * 5);
        }
      }
    }
  }
  uVar16 = 0xffffffff;
  uVar5 = uVar16;
  if ((local_8c8 != (gnode_t *)0x0) && (local_8c8[1].tag == NODE_LABEL_STAT)) {
    uVar5 = local_8c8[1].block_length;
  }
  if ((local_8d0 != (gnode_t *)0x0) && (local_8d0[1].tag == NODE_LABEL_STAT)) {
    uVar16 = local_8d0[1].block_length;
  }
  local_8b8 = uStackY_930;
  if (ast_02 == (gnode_t *)0x0) {
switchD_0011b0a7_default:
    v.field_1.n = 0;
    v.isa = local_8f8;
    goto LAB_0011b102;
  }
  switch(ast_02[1].tag) {
  case NODE_LIST_STAT:
    v = gravity_string_to_value((gravity_vm *)0x0,*(char **)&ast_02[1].block_length,0xffffffff);
    goto LAB_0011b102;
  case NODE_COMPOUND_STAT:
    ppgVar10 = &gravity_class_float;
    break;
  case NODE_LABEL_STAT:
    ppgVar10 = &gravity_class_int;
    break;
  case NODE_FLOW_STAT:
    v.field_1.n._0_1_ = *(long *)&ast_02[1].block_length != 0;
    v.isa = gravity_class_bool;
    v.field_1.n._1_7_ = 0;
    goto LAB_0011b102;
  default:
    goto switchD_0011b0a7_default;
  }
  v.field_1.n = *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)&ast_02[1].block_length;
  v.isa = *ppgVar10;
LAB_0011b102:
  local_8f8 = v.isa;
  pgVar2 = parser->delegate;
  if ((pgVar2 == (gravity_delegate_t *)0x0) ||
     (pgVar2->unittest_callback == (gravity_unittest_callback)0x0)) {
    gravity_value_free((gravity_vm *)0x0,v);
    pgVar11 = extraout_RAX_02;
  }
  else {
    pgVar11 = (gnode_t *)
              (*pgVar2->unittest_callback)
                        ((gravity_vm *)0x0,(error_type_t)local_8b8,local_8d8,(char *)local_8e0,v,
                         uVar5,uVar16,pgVar2->xdata);
  }
  ast = local_8f0;
  if (ast_00 != (gnode_t *)0x0) {
    gnode_free(ast_00);
    pgVar11 = extraout_RAX_03;
  }
  if (ast_01 != (gnode_t *)0x0) {
    gnode_free(ast_01);
    pgVar11 = extraout_RAX_04;
  }
  if (ast != (gnode_t *)0x0) {
    gnode_free(ast);
    pgVar11 = extraout_RAX_05;
  }
  if (local_8c8 != (gnode_t *)0x0) {
    gnode_free(local_8c8);
    pgVar11 = extraout_RAX_06;
  }
  if (local_8d0 != (gnode_t *)0x0) {
    gnode_free(local_8d0);
    pgVar11 = extraout_RAX_07;
  }
  if (ast_02 != (gnode_t *)0x0) {
    gnode_free(ast_02);
    pgVar11 = extraout_RAX_08;
  }
  return pgVar11;
}

Assistant:

static gnode_t *parse_macro_statement (gravity_parser_t *parser) {
    typedef enum {
        MACRO_UNKNOWN = 0,
        MACRO_UNITEST = 1,
        MACRO_INCLUDE = 2,
        MACRO_PUSH = 3,
        MACRO_POP = 4
    } builtin_macro;

    DEBUG_PARSER("parse_macro_statement");
    DECLARE_LEXER;

    // consume special # symbol
    gtoken_t type = gravity_lexer_next(lexer);
    assert(type == TOK_MACRO);

    // check for #! and interpret #! shebang bash as one line comment
    // only if found on first line
    if (gravity_lexer_peek(lexer) == TOK_OP_NOT && gravity_lexer_lineno(lexer) == 1) {
        // consume special ! symbol
        type = gravity_lexer_next(lexer);
        assert(type == TOK_OP_NOT);

        // skip until EOL
        gravity_lexer_skip_line(lexer);
        return NULL;
    }

    // macro has its own parser because I don't want to mess standard syntax
    const char *macroid = parse_identifier(parser);
    if (macroid == NULL) goto handle_error;

    // check macro
    builtin_macro macro_type = MACRO_UNKNOWN;
    if (string_cmp(macroid, "unittest") == 0) macro_type = MACRO_UNITEST;
    else if (string_cmp(macroid, "include") == 0) macro_type = MACRO_INCLUDE;
    else if (string_cmp(macroid, "push") == 0) macro_type = MACRO_PUSH;
    else if (string_cmp(macroid, "pop") == 0) macro_type = MACRO_POP;
    mem_free(macroid);

    gtoken_s token = gravity_lexer_token(lexer);
    token.type = TOK_MACRO;
    PARSER_CALL_CALLBACK(token);

    switch (macro_type) {
        case MACRO_UNITEST:
            return parse_unittest_macro(parser);
            break;

        case MACRO_INCLUDE:
            return parse_include_macro(parser);
            break;

        case MACRO_PUSH:
            break;

        case MACRO_POP:
            break;

        case MACRO_UNKNOWN:
            break;
    }

handle_error:
    REPORT_WARNING(gravity_lexer_token(lexer), "%s", "Unknown macro token. Declaration will be ignored.");
    return NULL;
}